

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O2

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  uint _c;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  uint _w;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  void *pvVar18;
  int i_2;
  int iVar19;
  int iVar20;
  ulong uVar21;
  void *pvVar22;
  ulong uVar23;
  int i_1;
  int iVar24;
  long lVar25;
  long lVar26;
  void *pvVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  int kj;
  ulong uVar32;
  float fVar33;
  void *local_138;
  void *local_128;
  allocator_type local_e9;
  void *local_e8;
  void *local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  void *local_b0;
  Mat local_a8;
  long local_60;
  long local_58;
  void *local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar28 = bottom_blob->w;
  iVar19 = bottom_blob->h;
  _c = bottom_blob->c;
  sVar4 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      make_padding(this,bottom_blob,&local_a8,opt);
      iVar11 = local_a8.h;
      iVar20 = local_a8.w;
      iVar19 = -100;
      if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
        iVar30 = (local_a8.w - this->kernel_w) / this->stride_w;
        iVar9 = (local_a8.h - this->kernel_h) / this->stride_h;
        iVar12 = iVar30 + 1;
        Mat::create(top_blob,iVar12,iVar9 + 1,_c,sVar4,opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar15 = (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar15,&local_e9);
          iVar19 = this->kernel_w;
          iVar10 = iVar20 - iVar19;
          lVar16 = 0;
          iVar13 = 0;
          for (iVar24 = 0; iVar24 < this->kernel_h; iVar24 = iVar24 + 1) {
            for (lVar31 = 0; iVar29 = (int)lVar31, iVar29 < iVar19; lVar31 = lVar31 + 1) {
              _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)lVar16 + lVar31] = iVar13 + iVar29;
              iVar19 = this->kernel_w;
            }
            iVar13 = iVar13 + iVar10 + iVar29;
            lVar16 = (int)lVar16 + lVar31;
          }
          iVar19 = (int)uVar15;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar10 = 0;
              iVar19 = 0;
              if (this->pad_mode == 0) {
                iVar10 = (bottom_blob->w - local_a8.w) + this->pad_left + this->pad_right;
                iVar19 = (bottom_blob->h - local_a8.h) + this->pad_top + this->pad_bottom;
              }
              local_b0 = local_a8.data;
              local_50 = top_blob->data;
              local_58 = top_blob->cstep * top_blob->elemsize;
              iVar10 = iVar10 + iVar20;
              local_b8 = (long)iVar12;
              local_d0 = (long)iVar9;
              if ((int)_c < 1) {
                _c = 0;
              }
              local_60 = local_a8.cstep *
                         CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
              lVar16 = (long)local_a8.w *
                       CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
              local_e0 = (void *)CONCAT44(local_e0._4_4_,iVar10);
              local_e8 = (void *)CONCAT44(local_e8._4_4_,iVar19 + iVar11);
              for (uVar15 = 0; uVar15 != _c; uVar15 = uVar15 + 1) {
                local_128 = (void *)(local_58 * uVar15 + (long)local_50);
                local_c0 = (long)this->stride_h;
                local_d8 = lVar16 * local_c0;
                pvVar27 = local_b0;
                lVar31 = 0;
                while (lVar25 = lVar31, lVar25 <= local_d0) {
                  iVar20 = this->stride_w;
                  uVar17 = (ulong)(uint)this->kernel_h;
                  if (this->kernel_h < 1) {
                    uVar17 = 0;
                  }
                  lVar31 = 0;
                  pvVar14 = pvVar27;
                  for (lVar26 = 0; lVar26 <= iVar30; lVar26 = lVar26 + 1) {
                    uVar23 = 0;
                    uVar21 = (ulong)(uint)this->kernel_w;
                    if (this->kernel_w < 1) {
                      uVar21 = uVar23;
                    }
                    fVar33 = 0.0;
                    iVar9 = 0;
                    pvVar22 = pvVar14;
                    for (; uVar23 != uVar17; uVar23 = uVar23 + 1) {
                      lVar2 = uVar23 + lVar25 * local_c0;
                      if (this->pad_top <= lVar2) {
                        if ((iVar19 + iVar11) - this->pad_bottom <= lVar2) break;
                        for (uVar32 = 0; uVar21 != uVar32; uVar32 = uVar32 + 1) {
                          if ((long)this->pad_left <= (long)(lVar31 + uVar32)) {
                            if ((long)(iVar10 - this->pad_right) <= (long)(lVar31 + uVar32)) break;
                            fVar33 = fVar33 + *(float *)((long)pvVar22 + uVar32 * 4);
                            iVar9 = iVar9 + 1;
                          }
                        }
                      }
                      pvVar22 = (void *)((long)pvVar22 + lVar16);
                    }
                    *(float *)((long)local_128 + lVar26 * 4) = fVar33 / (float)iVar9;
                    pvVar14 = (void *)((long)pvVar14 + (long)iVar20 * 4);
                    lVar31 = lVar31 + iVar20;
                  }
                  local_128 = (void *)((long)local_128 + local_b8 * 4);
                  pvVar27 = (void *)((long)pvVar27 + local_d8);
                  local_c8 = lVar25;
                  lVar31 = lVar25 + 1;
                }
                local_b0 = (void *)((long)local_b0 + local_60);
              }
            }
            else {
              sVar4 = top_blob->cstep;
              sVar5 = top_blob->elemsize;
              pvVar27 = top_blob->data;
              uVar17 = 0;
              uVar15 = uVar15 & 0xffffffff;
              if (iVar19 < 1) {
                uVar15 = uVar17;
              }
              uVar21 = (ulong)_c;
              if ((int)_c < 1) {
                uVar21 = uVar17;
              }
              for (; uVar17 != uVar21; uVar17 = uVar17 + 1) {
                pvVar14 = (void *)(sVar4 * sVar5 * uVar17 + (long)pvVar27);
                for (iVar20 = 0; iVar20 <= iVar9; iVar20 = iVar20 + 1) {
                  iVar11 = this->stride_h;
                  iVar10 = this->stride_w;
                  for (lVar16 = 0; lVar16 <= iVar30; lVar16 = lVar16 + 1) {
                    fVar33 = 0.0;
                    for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
                      fVar33 = fVar33 + *(float *)((long)local_a8.data +
                                                  (long)_space_ofs.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar23] *
                                                  4 + lVar16 * iVar10 * 4 +
                                                      (long)iVar20 * (long)iVar11 *
                                                      (long)local_a8.w *
                                                      CONCAT44(local_a8.elemsize._4_4_,
                                                               (undefined4)local_a8.elemsize) +
                                                      local_a8.cstep *
                                                      CONCAT44(local_a8.elemsize._4_4_,
                                                               (undefined4)local_a8.elemsize) *
                                                      uVar17);
                    }
                    *(float *)((long)pvVar14 + lVar16 * 4) = fVar33 * (1.0 / (float)iVar19);
                  }
                  pvVar14 = (void *)((long)pvVar14 + (long)iVar12 * 4);
                }
              }
            }
          }
          else if (this->pooling_type == 0) {
            pvVar27 = top_blob->data;
            sVar4 = top_blob->cstep;
            sVar5 = top_blob->elemsize;
            uVar17 = 0;
            uVar15 = uVar15 & 0xffffffff;
            if (iVar19 < 1) {
              uVar15 = uVar17;
            }
            uVar21 = (ulong)_c;
            if ((int)_c < 1) {
              uVar21 = uVar17;
            }
            for (; uVar17 != uVar21; uVar17 = uVar17 + 1) {
              pvVar14 = (void *)(sVar4 * sVar5 * uVar17 + (long)pvVar27);
              for (iVar19 = 0; iVar19 <= iVar9; iVar19 = iVar19 + 1) {
                iVar20 = this->stride_h;
                iVar11 = this->stride_w;
                for (lVar16 = 0; lVar16 <= iVar30; lVar16 = lVar16 + 1) {
                  pfVar1 = (float *)((long)local_a8.data +
                                    lVar16 * iVar11 * 4 +
                                    (long)iVar19 * (long)iVar20 *
                                    (long)local_a8.w *
                                    CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize)
                                    + local_a8.cstep *
                                      CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize
                                              ) * uVar17);
                  fVar33 = *pfVar1;
                  for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
                    fVar3 = pfVar1[_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar23]];
                    if (fVar33 <= fVar3) {
                      fVar33 = fVar3;
                    }
                  }
                  *(float *)((long)pvVar14 + lVar16 * 4) = fVar33;
                }
                pvVar14 = (void *)((long)pvVar14 + (long)iVar12 * 4);
              }
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
          iVar19 = 0;
        }
      }
      piVar6 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar6 == (int *)0x0) {
        return iVar19;
      }
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 != 0) {
        return iVar19;
      }
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        return iVar19;
      }
      free(local_a8.data);
      return iVar19;
    }
    _w = uVar28;
    if (this->out_w != 0xffffff17) {
      _w = this->out_w;
    }
    iVar20 = this->out_h;
    if (this->out_h == -0xe9) {
      iVar20 = iVar19;
    }
    if (iVar20 == iVar19 && _w == uVar28) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar6 = bottom_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = top_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar6 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar6;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar19 = bottom_blob->w;
      iVar20 = bottom_blob->h;
      iVar11 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar19;
      top_blob->h = iVar20;
      top_blob->d = iVar11;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    Mat::create(top_blob,_w,iVar20,_c,sVar4,opt->blob_allocator);
    pvVar27 = top_blob->data;
    if (pvVar27 == (void *)0x0) {
      return -100;
    }
    sVar4 = top_blob->cstep;
    if ((long)top_blob->c * sVar4 == 0) {
      return -100;
    }
    if (this->pooling_type == 0) {
      pvVar14 = bottom_blob->data;
      lVar16 = bottom_blob->cstep * bottom_blob->elemsize;
      sVar5 = top_blob->elemsize;
      uVar15 = 0;
      if (0 < (int)_w) {
        uVar15 = (ulong)_w;
      }
      iVar11 = iVar20;
      if (iVar20 < 1) {
        iVar11 = 0;
      }
      uVar17 = (ulong)_c;
      if ((int)_c < 1) {
        uVar17 = 0;
      }
      lVar31 = (long)(int)uVar28 * 4;
      local_e8 = pvVar14;
      for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
        pvVar22 = (void *)(sVar4 * sVar5 * uVar21 + (long)pvVar27);
        iVar30 = 0;
        while (iVar30 != iVar11) {
          iVar9 = (iVar30 * iVar19) / iVar20;
          iVar30 = iVar30 + 1;
          uVar23 = 0;
          while (uVar23 != uVar15) {
            iVar12 = (int)((int)uVar23 * uVar28) / (int)_w;
            fVar33 = *(float *)((long)pvVar14 +
                               (long)(int)(iVar12 + uVar28 * iVar9) * 4 + lVar16 * uVar21);
            pvVar18 = (void *)(lVar31 * iVar9 + (long)local_e8);
            for (lVar25 = (long)iVar9; lVar26 = (long)iVar12,
                lVar25 < (iVar30 * iVar19 + iVar20 + -1) / iVar20; lVar25 = lVar25 + 1) {
              for (; lVar26 < (int)((int)(uVar23 + 1) * uVar28 + (_w - 1)) / (int)_w;
                  lVar26 = lVar26 + 1) {
                fVar3 = *(float *)((long)pvVar18 + lVar26 * 4);
                if (fVar33 <= fVar3) {
                  fVar33 = fVar3;
                }
              }
              pvVar18 = (void *)((long)pvVar18 + lVar31);
            }
            *(float *)((long)pvVar22 + uVar23 * 4) = fVar33;
            uVar23 = uVar23 + 1;
          }
          pvVar22 = (void *)((long)pvVar22 + (long)(int)_w * 4);
        }
        local_e8 = (void *)((long)local_e8 + lVar16);
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      local_e0 = bottom_blob->data;
      sVar5 = top_blob->elemsize;
      sVar7 = bottom_blob->cstep;
      uVar15 = 0;
      if (0 < (int)_w) {
        uVar15 = (ulong)_w;
      }
      iVar11 = iVar20;
      if (iVar20 < 1) {
        iVar11 = 0;
      }
      uVar17 = (ulong)_c;
      if ((int)_c < 1) {
        uVar17 = 0;
      }
      sVar8 = bottom_blob->elemsize;
      lVar16 = (long)(int)uVar28 * 4;
      for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
        local_138 = (void *)(sVar4 * sVar5 * uVar21 + (long)pvVar27);
        iVar30 = 0;
        while (iVar30 != iVar11) {
          iVar12 = (iVar30 * iVar19) / iVar20;
          iVar30 = iVar30 + 1;
          iVar9 = (iVar30 * iVar19 + iVar20 + -1) / iVar20;
          uVar23 = 0;
          while (uVar23 != uVar15) {
            iVar13 = (int)((int)uVar23 * uVar28) / (int)_w;
            iVar10 = (int)((int)(uVar23 + 1) * uVar28 + (_w - 1)) / (int)_w;
            fVar33 = 0.0;
            pvVar14 = (void *)(lVar16 * iVar12 + (long)local_e0);
            for (lVar31 = (long)iVar12; lVar25 = (long)iVar13, lVar31 < iVar9; lVar31 = lVar31 + 1)
            {
              for (; lVar25 < iVar10; lVar25 = lVar25 + 1) {
                fVar33 = fVar33 + *(float *)((long)pvVar14 + lVar25 * 4);
              }
              pvVar14 = (void *)((long)pvVar14 + lVar16);
            }
            *(float *)((long)local_138 + uVar23 * 4) =
                 fVar33 / ((float)(iVar10 - iVar13) * (float)(iVar9 - iVar12));
            uVar23 = uVar23 + 1;
          }
          local_138 = (void *)((long)local_138 + (long)(int)_w * 4);
        }
        local_e0 = (void *)((long)local_e0 + sVar7 * sVar8);
      }
      return 0;
    }
  }
  else {
    Mat::create(top_blob,_c,sVar4,opt->blob_allocator);
    pvVar27 = top_blob->data;
    if (pvVar27 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar28 = iVar19 * uVar28;
    if (this->pooling_type == 0) {
      pvVar14 = bottom_blob->data;
      lVar16 = bottom_blob->cstep * bottom_blob->elemsize;
      uVar15 = (ulong)uVar28;
      if ((int)uVar28 < 1) {
        uVar15 = 0;
      }
      uVar17 = (ulong)_c;
      if ((int)_c < 1) {
        uVar17 = 0;
      }
      pvVar22 = pvVar14;
      for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
        fVar33 = *(float *)((long)pvVar14 + lVar16 * uVar21);
        for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
          fVar3 = *(float *)((long)pvVar22 + uVar23 * 4);
          if (fVar33 <= fVar3) {
            fVar33 = fVar3;
          }
        }
        *(float *)((long)pvVar27 + uVar21 * 4) = fVar33;
        pvVar22 = (void *)((long)pvVar22 + lVar16);
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      pvVar14 = bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      uVar15 = (ulong)uVar28;
      if ((int)uVar28 < 1) {
        uVar15 = 0;
      }
      uVar17 = (ulong)_c;
      if ((int)_c < 1) {
        uVar17 = 0;
      }
      sVar5 = bottom_blob->elemsize;
      for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
        fVar33 = 0.0;
        for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
          fVar33 = fVar33 + *(float *)((long)pvVar14 + uVar23 * 4);
        }
        *(float *)((long)pvVar27 + uVar21 * 4) = fVar33 * (1.0 / (float)(int)uVar28);
        pvVar14 = (void *)((long)pvVar14 + sVar4 * sVar5);
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        int _out_w = out_w == -233 ? w : out_w;
        int _out_h = out_h == -233 ? h : out_h;

        if (_out_w == w && _out_h == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_out_w, _out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < _out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / _out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                    for (int j = 0; j < _out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / _out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += _out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < _out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / _out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < _out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / _out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += _out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}